

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O2

bool __thiscall TypeInfo::testInvaild(TypeInfo *this)

{
  XStr XVar1;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  XMLCh *pXVar5;
  ostream *poVar6;
  char *pcVar7;
  long lVar8;
  wchar16 *pwVar9;
  DOMElement *pDVar10;
  long *plVar11;
  undefined1 uVar12;
  XStr local_38;
  XStr local_30;
  
  plVar3 = (long *)(**(code **)(*(long *)this->doc + 0x68))();
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"rootType");
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar2) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  uVar12 = tmp;
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2a9);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"rootType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar3 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar3 + 0x18))(plVar3);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  XStr::XStr(&local_38,"invalidTest");
  pDVar10 = findElement(this,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  XStr::XStr(&local_38,"");
  XVar1.fUnicodeForm = local_38.fUnicodeForm;
  XStr::XStr(&local_30,"simple");
  plVar3 = (long *)(**(code **)(*(long *)pDVar10 + 0x198))
                             (pDVar10,XVar1.fUnicodeForm,local_30.fUnicodeForm);
  XStr::~XStr(&local_30);
  XStr::~XStr(&local_38);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"stringDerivedType");
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar2) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2af);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"stringDerivedType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar3 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar3 + 0x18))(plVar3);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar12 = 0;
  }
  XStr::XStr(&local_38,"");
  XVar1.fUnicodeForm = local_38.fUnicodeForm;
  XStr::XStr(&local_30,"invalid");
  plVar3 = (long *)(**(code **)(*(long *)pDVar10 + 0x198))
                             (pDVar10,XVar1.fUnicodeForm,local_30.fUnicodeForm);
  XStr::~XStr(&local_30);
  XStr::~XStr(&local_38);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)0x0);
  if (bVar2) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    tmp = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)0x0);
    if (!tmp) goto LAB_00115524;
  }
  else {
    tmp = false;
LAB_00115524:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2b2);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar3 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar3 + 0x18))(plVar3);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar12 = 0;
  }
  plVar3 = (long *)(**(code **)(*(long *)pDVar10 + 0x38))(pDVar10);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"stringDerivedType");
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar2) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2b5);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"stringDerivedType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar12 = 0;
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"baseComplex");
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar2) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2b8);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"baseComplex");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar12 = 0;
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"stringDerivedType");
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar2) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,700);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"stringDerivedType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar12 = 0;
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"baseComplex");
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar2) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2bf);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"baseComplex");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar12 = 0;
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"uType");
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar2) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2c2);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"uType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar12 = 0;
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)0x0);
  if (bVar2) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    tmp = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)0x0);
    if (!tmp) goto LAB_001162b6;
  }
  else {
    tmp = false;
LAB_001162b6:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2c5);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar12 = 0;
  }
  plVar4 = (long *)(**(code **)(*plVar3 + 0x38))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x50))(plVar4);
  plVar11 = (long *)(**(code **)(*plVar4 + 0x1d8))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar11 + 0x10))(plVar11);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)0x0);
  if (bVar2) {
    plVar11 = (long *)(**(code **)(*plVar4 + 0x1d8))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar11 + 0x18))(plVar11);
    tmp = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)0x0);
    if (tmp) goto LAB_001165fd;
  }
  else {
    tmp = false;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2c8);
  poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
  pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                             ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  poVar6 = std::operator<<(poVar6,pcVar7);
  poVar6 = std::operator<<(poVar6,"\', uri \'");
  pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                             ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  std::operator<<(poVar6,pcVar7);
  std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
  plVar11 = (long *)(**(code **)(*plVar4 + 0x1d8))(plVar4);
  lVar8 = (**(code **)(*plVar11 + 0x10))(plVar11);
  if (lVar8 == 0) {
    pcVar7 = "(null)";
  }
  else {
    plVar11 = (long *)(**(code **)(*plVar4 + 0x1d8))(plVar4);
    pwVar9 = (wchar16 *)(**(code **)(*plVar11 + 0x10))(plVar11);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  std::operator<<((ostream *)&std::cerr,pcVar7);
  std::operator<<((ostream *)&std::cerr,"\', uri \'");
  plVar11 = (long *)(**(code **)(*plVar4 + 0x1d8))(plVar4);
  lVar8 = (**(code **)(*plVar11 + 0x18))(plVar11);
  if (lVar8 == 0) {
    pcVar7 = "(null)";
  }
  else {
    plVar4 = (long *)(**(code **)(*plVar4 + 0x1d8))(plVar4);
    pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  std::operator<<((ostream *)&std::cerr,pcVar7);
  poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
  std::endl<char,std::char_traits<char>>(poVar6);
  uVar12 = 0;
LAB_001165fd:
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"attrOnlyType");
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar2) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2cb);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"attrOnlyType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar12 = 0;
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"attrOnlyType");
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar2) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2ce);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"attrOnlyType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar12 = 0;
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"prohibitedAttrType");
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar2) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2d1);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"prohibitedAttrType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar3 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar3 + 0x18))(plVar3);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar12 = 0;
  }
  return (bool)uVar12;
}

Assistant:

bool TypeInfo::testInvaild() {

    bool passed = true;
    DOMNode *docEle = doc->getDocumentElement();
    UNUSED(docEle); // silence warning
    DOMAttr *testAttr;


    DOMTYPEINFOTEST(((DOMElement *)docEle)->getSchemaTypeInfo(), X("rootType"), X(""), __LINE__);

    //element invalidTest
    DOMElement *testEle = findElement(X("invalidTest"));

    testAttr = testEle->getAttributeNodeNS(X(""), X("simple"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testAttr = testEle->getAttributeNodeNS(X(""), X("invalid"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), 0, 0, __LINE__);

    testEle = (DOMElement *)testEle->getFirstChild()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("baseComplex"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    // this is a "number" of type "base" but it has a xsi:type="stringDerivedType"
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("baseComplex"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("uType"), X(""), __LINE__);
    //an undeclared element does not have anon value. Test this here
    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), 0, 0, __LINE__);

    DOMElement *testEle2 = (DOMElement *)testEle->getFirstChild()->getNextSibling();
    DOMTYPEINFOTEST(testEle2->getSchemaTypeInfo(), 0, 0, __LINE__);
    
    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("attrOnlyType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("attrOnlyType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("prohibitedAttrType"), X(""), __LINE__);

    return passed;
}